

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_insert.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::ResolveDefaultsProjection
          (PhysicalPlanGenerator *this,LogicalInsert *op,PhysicalOperator *child)

{
  size_type __n;
  ColumnList *this_00;
  ColumnDefinition *this_01;
  storage_t *psVar1;
  PhysicalIndex __n_00;
  reference pvVar2;
  LogicalType *pLVar3;
  reference __args;
  PhysicalOperator *pPVar4;
  InternalException *this_02;
  pointer *__ptr;
  ColumnListIterator CVar5;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_e8;
  Expression *local_e0;
  ColumnLogicalIteratorInternal __begin1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  select_list;
  vector<duckdb::LogicalType,_true> types;
  unsigned_long mapped_index;
  ColumnLogicalIteratorInternal __end1;
  ColumnListIterator local_40;
  
  if ((op->column_index_map).internal_vector.
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (op->column_index_map).internal_vector.
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    select_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    select_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    select_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = TableCatalogEntry::GetColumns(op->table);
    CVar5 = ColumnList::Physical(this_00);
    local_40.list = CVar5.list;
    local_40.physical = CVar5.physical;
    ColumnList::ColumnListIterator::begin(&__begin1,&local_40);
    ColumnList::ColumnListIterator::end(&__end1,&local_40);
    while (((__begin1.pos != __end1.pos || (__begin1.end != __end1.end)) ||
           (__begin1.list != __end1.list))) {
      this_01 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*(&__begin1);
      psVar1 = ColumnDefinition::StorageOid(this_01);
      __n = *psVar1;
      __n_00 = ColumnDefinition::Physical(this_01);
      pvVar2 = vector<unsigned_long,_true>::get<true>
                         (&(op->column_index_map).internal_vector,__n_00.index);
      mapped_index = *pvVar2;
      if (mapped_index == 0xffffffffffffffff) {
        __args = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(&op->bound_defaults,__n);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&select_list,__args);
      }
      else {
        pLVar3 = ColumnDefinition::Type(this_01);
        make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType_const&,unsigned_long&>
                  ((duckdb *)&local_e0,pLVar3,&mapped_index);
        local_e8._M_head_impl = local_e0;
        local_e0 = (Expression *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&select_list,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_e8);
        if (local_e8._M_head_impl != (Expression *)0x0) {
          (*((local_e8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_e8._M_head_impl = (Expression *)0x0;
        if (local_e0 != (Expression *)0x0) {
          (*(local_e0->super_BaseExpression)._vptr_BaseExpression[1])();
        }
      }
      pLVar3 = ColumnDefinition::Type(this_01);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 pLVar3);
      __begin1.pos = __begin1.pos + 1;
    }
    pPVar4 = Make<duckdb::PhysicalProjection,duckdb::vector<duckdb::LogicalType,true>,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                       (this,&types,&select_list,&child->estimated_cardinality);
    __begin1.list = (ColumnList *)child;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&pPVar4->children,(reference_wrapper<duckdb::PhysicalOperator> *)&__begin1);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&select_list);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    return pPVar4;
  }
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&__begin1,"No defaults to push",(allocator *)&__end1);
  InternalException::InternalException(this_02,(string *)&__begin1);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::ResolveDefaultsProjection(LogicalInsert &op, PhysicalOperator &child) {
	if (op.column_index_map.empty()) {
		throw InternalException("No defaults to push");
	}
	// columns specified by the user, push a projection
	vector<LogicalType> types;
	vector<unique_ptr<Expression>> select_list;
	for (auto &col : op.table.GetColumns().Physical()) {
		auto storage_idx = col.StorageOid();
		auto mapped_index = op.column_index_map[col.Physical()];
		if (mapped_index == DConstants::INVALID_INDEX) {
			// push default value
			select_list.push_back(std::move(op.bound_defaults[storage_idx]));
		} else {
			// push reference
			select_list.push_back(make_uniq<BoundReferenceExpression>(col.Type(), mapped_index));
		}
		types.push_back(col.Type());
	}
	auto &proj = Make<PhysicalProjection>(std::move(types), std::move(select_list), child.estimated_cardinality);
	proj.children.push_back(child);
	return proj;
}